

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

void stripctrl_reset(StripCtrlChars *sccpub)

{
  StripCtrlCharsImpl *scc;
  StripCtrlChars *sccpub_local;
  
  memset((void *)((long)&sccpub[-2].binarysink_[0].write + 4),0,0xc);
  memset(&sccpub[-7].binarysink_[0].binarysink_,0,8);
  memset(sccpub + -6,0,8);
  *(undefined1 *)((long)&sccpub[-1].binarysink_[0].write + 1) = 1;
  return;
}

Assistant:

void stripctrl_reset(StripCtrlChars *sccpub)
{
    StripCtrlCharsImpl *scc =
        container_of(sccpub, StripCtrlCharsImpl, public);

    /*
     * Clear all the fields that might have been in the middle of a
     * multibyte character or non-default shift state, so that we can
     * start converting a fresh piece of data to send to a channel
     * that hasn't seen the previous output.
     */
    memset(&scc->utf8, 0, sizeof(scc->utf8));
    memset(&scc->mbs_in, 0, sizeof(scc->mbs_in));
    memset(&scc->mbs_out, 0, sizeof(scc->mbs_out));

    /*
     * Also, reset the line-limiting system to its starting state.
     */
    scc->line_start = true;
}